

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceWithMatchExpr::serializeTo
          (SequenceWithMatchExpr *this,ASTSerializer *serializer)

{
  size_t __n;
  string_view name;
  string_view name_00;
  bool bVar1;
  ASTSerializer *in_RSI;
  ASTSerializer *in_RDI;
  SequenceRepetition *unaff_retaddr;
  Expression *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  Expression *in_stack_ffffffffffffff78;
  ASTSerializer *in_stack_ffffffffffffff80;
  ASTSerializer *pAVar2;
  ASTSerializer *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_50;
  value_type_pointer *local_48;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  pAVar2 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff88);
  __n._0_1_ = in_RDI->includeAddrs;
  __n._1_1_ = in_RDI->includeSourceInfo;
  __n._2_1_ = in_RDI->detailedTypeInfo;
  __n._3_1_ = in_RDI->tryConstantFold;
  __n._4_4_ = *(undefined4 *)&in_RDI->field_0x14;
  ASTSerializer::write(in_RSI,local_20,local_18,__n);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRepetition> *)0x9b5847)
  ;
  if (bVar1) {
    in_stack_ffffffffffffff88 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    name._M_str = (char *)in_RSI;
    name._M_len = (size_t)in_stack_ffffffffffffff88;
    ASTSerializer::writeProperty(in_stack_ffffffffffffff80,name);
    std::optional<slang::ast::SequenceRepetition>::operator->
              ((optional<slang::ast::SequenceRepetition> *)0x9b588a);
    SequenceRepetition::serializeTo(unaff_retaddr,pAVar2);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff88);
  name_00._M_str = in_stack_ffffffffffffffa0;
  name_00._M_len = (size_t)in_RDI;
  ASTSerializer::startArray(in_RSI,name_00);
  local_48 = &(in_RDI->visiting).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
              .arrays.elements_;
  local_50._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff78);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff88);
  pAVar2 = local_10;
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)pAVar2,
                            (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff78), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(&local_50);
    ASTSerializer::serialize(pAVar2,in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_50);
  }
  ASTSerializer::endArray((ASTSerializer *)0x9b5940);
  return;
}

Assistant:

void SequenceWithMatchExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);
    if (repetition) {
        serializer.writeProperty("repetition");
        repetition->serializeTo(serializer);
    }

    serializer.startArray("matchItems");
    for (auto item : matchItems)
        serializer.serialize(*item);
    serializer.endArray();
}